

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<bool>::internalSetData<unsigned_long>(Parameter<bool> *this,unsigned_long data)

{
  bool bVar1;
  unsigned_long in_RSI;
  long in_RDI;
  bool result;
  bool tmp;
  RepType_conflict local_11 [17];
  
  local_11[0] = false;
  bVar1 = ParameterTraits<bool>::convert<unsigned_long>(in_RSI,local_11);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(byte *)(in_RDI + 0x2b) = local_11[0] & 1;
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }